

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::cliputil::clipTriangleTwoVertices
               (vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                *clippedEdges,ClipVolumePlane *plane,TriangleVertex *v0,TriangleVertex *clipped1,
               TriangleVertex *clipped2)

{
  bool bVar1;
  bool bVar2;
  double a;
  double a_00;
  TriangleVertex *local_1c0;
  TriangleVertex *local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  undefined1 local_190 [8];
  ClipVec4 anotherPointOnLine_1;
  ClipVec4 approximatedClipPoint_1;
  ClipFloat hitDist_1;
  TriangleVertex *middle_1;
  TriangleVertex *outside_1;
  TriangleVertex *inside_1;
  undefined1 local_110 [8];
  ClipVec4 anotherPointOnLine;
  ClipVec4 approximatedClipPoint;
  ClipFloat hitDist;
  TriangleVertex *middle;
  TriangleVertex *outside;
  TriangleVertex *inside;
  undefined1 auStack_a8 [6];
  bool unclippableVertex2;
  bool unclippableVertex1;
  TriangleVertex mid2;
  TriangleVertex mid1;
  ClipFloat unclippableLimit;
  TriangleVertex *clipped2_local;
  TriangleVertex *clipped1_local;
  TriangleVertex *v0_local;
  ClipVolumePlane *plane_local;
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  *clippedEdges_local;
  
  TriangleVertex::TriangleVertex((TriangleVertex *)(mid2.weight + 2));
  TriangleVertex::TriangleVertex((TriangleVertex *)auStack_a8);
  bVar1 = false;
  bVar2 = false;
  (*plane->_vptr_ClipVolumePlane[1])(plane,v0,clipped1);
  if (a < 1.0) {
    tcu::mix<4>((Vector<double,_4> *)(anotherPointOnLine.m_data + 3),&v0->position,
                &clipped1->position,a);
    local_1b8 = clipped1;
    if (0.5 < a) {
      local_1b8 = v0;
    }
    tcu::Vector<double,_4>::Vector((Vector<double,_4> *)local_110,&local_1b8->position);
    (*plane->_vptr_ClipVolumePlane[2])(&inside_1,plane,anotherPointOnLine.m_data + 3,local_110);
    mid2.weight[2] = (ClipFloat)inside_1;
    tcu::mix(v0->weight[0],clipped1->weight[0],a);
    tcu::mix(v0->weight[1],clipped1->weight[1],a);
    tcu::mix(v0->weight[2],clipped1->weight[2],a);
  }
  else {
    bVar1 = true;
  }
  (*plane->_vptr_ClipVolumePlane[1])(plane,v0,clipped2);
  if (a_00 < 1.0) {
    tcu::mix<4>((Vector<double,_4> *)(anotherPointOnLine_1.m_data + 3),&v0->position,
                &clipped2->position,a_00);
    local_1c0 = clipped2;
    if (0.5 < a_00) {
      local_1c0 = v0;
    }
    tcu::Vector<double,_4>::Vector((Vector<double,_4> *)local_190,&local_1c0->position);
    (*plane->_vptr_ClipVolumePlane[2])(&local_1b0,plane,anotherPointOnLine_1.m_data + 3,local_190);
    _auStack_a8 = local_1b0;
    mid2.position.m_data[0] = local_1a8;
    mid2.position.m_data[1] = local_1a0;
    mid2.position.m_data[2] = local_198;
    mid2.position.m_data[3] = tcu::mix(v0->weight[0],clipped2->weight[0],a_00);
    mid2.weight[0] = tcu::mix(v0->weight[1],clipped2->weight[1],a_00);
    mid2.weight[1] = tcu::mix(v0->weight[2],clipped2->weight[2],a_00);
  }
  else {
    bVar2 = true;
  }
  if ((bVar1) || (bVar2)) {
    if ((bVar1) || (!bVar2)) {
      if ((!bVar1) || (bVar2)) {
        std::
        vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
        ::push_back(clippedEdges,v0);
        std::
        vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
        ::push_back(clippedEdges,clipped1);
        std::
        vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
        ::push_back(clippedEdges,clipped2);
      }
      else {
        std::
        vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
        ::push_back(clippedEdges,v0);
        std::
        vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
        ::push_back(clippedEdges,clipped1);
        std::
        vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
        ::push_back(clippedEdges,(value_type *)auStack_a8);
      }
    }
    else {
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,v0);
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,(value_type *)(mid2.weight + 2));
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,clipped2);
    }
  }
  else {
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,v0);
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,(value_type *)(mid2.weight + 2));
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,(value_type *)auStack_a8);
  }
  return;
}

Assistant:

void clipTriangleTwoVertices (std::vector<TriangleVertex>& clippedEdges, const ClipVolumePlane& plane, const TriangleVertex& v0, const TriangleVertex& clipped1, const TriangleVertex& clipped2)
{
	const ClipFloat	unclippableLimit = (ClipFloat)1.0;

	// calc clip pos
	TriangleVertex	mid1;
	TriangleVertex	mid2;
	bool			unclippableVertex1 = false;
	bool			unclippableVertex2 = false;

	{
		const TriangleVertex&	inside	= v0;
		const TriangleVertex&	outside	= clipped1;
		      TriangleVertex&	middle	= mid1;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= unclippableLimit)
		{
			// this edge cannot be clipped because the edge is really close to the volume boundary
			unclippableVertex1 = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	{
		const TriangleVertex&	inside	= v0;
		const TriangleVertex&	outside	= clipped2;
		      TriangleVertex&	middle	= mid2;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= unclippableLimit)
		{
			// this edge cannot be clipped because the edge is really close to the volume boundary
			unclippableVertex2 = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	if (!unclippableVertex1 && !unclippableVertex2)
	{
		// gen triangle (v0) -> mid1 -> mid2
		clippedEdges.push_back(v0);
		clippedEdges.push_back(mid1);
		clippedEdges.push_back(mid2);
	}
	else if (!unclippableVertex1 && unclippableVertex2)
	{
		// clip just vertex 1
		clippedEdges.push_back(v0);
		clippedEdges.push_back(mid1);
		clippedEdges.push_back(clipped2);
	}
	else if (unclippableVertex1 && !unclippableVertex2)
	{
		// clip just vertex 2
		clippedEdges.push_back(v0);
		clippedEdges.push_back(clipped1);
		clippedEdges.push_back(mid2);
	}
	else
	{
		// don't modify
		clippedEdges.push_back(v0);
		clippedEdges.push_back(clipped1);
		clippedEdges.push_back(clipped2);
	}
}